

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::multWithBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *x,
              SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *result)

{
  uint *puVar1;
  int iVar2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  undefined8 uVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  uint uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  long lVar9;
  fpclass_type fVar10;
  int32_t iVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_d8;
  cpp_dec_float<50U,_int,_void> local_98;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(result);
  if (0 < (int)((ulong)((long)(x->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(x->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    lVar9 = 0;
    do {
      pSVar3 = (this->matrix).data[lVar9];
      local_98.fpclass = cpp_dec_float_finite;
      local_98.prec_elem = 10;
      local_98.data._M_elems[0] = 0;
      local_98.data._M_elems[1] = 0;
      local_98.data._M_elems[2] = 0;
      local_98.data._M_elems[3] = 0;
      local_98.data._M_elems[4] = 0;
      local_98.data._M_elems[5] = 0;
      local_98.data._M_elems._24_5_ = 0;
      local_98.data._M_elems[7]._1_3_ = 0;
      local_98.data._M_elems._32_5_ = 0;
      local_98.data._M_elems[9]._1_3_ = 0;
      local_98.exp = 0;
      local_98.neg = false;
      iVar2 = pSVar3->memused;
      if (iVar2 < 1) {
        local_98.neg = false;
        local_98.exp = 0;
        fVar10 = cpp_dec_float_finite;
        iVar11 = 10;
      }
      else {
        pNVar8 = pSVar3->m_elem;
        uVar7 = iVar2 + 1;
        do {
          pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((x->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pNVar8->idx);
          local_d8.val.m_backend.fpclass = cpp_dec_float_finite;
          local_d8.val.m_backend.prec_elem = 10;
          local_d8.val.m_backend.data._M_elems[0] = 0;
          local_d8.val.m_backend.data._M_elems[1] = 0;
          local_d8.val.m_backend.data._M_elems[2] = 0;
          local_d8.val.m_backend.data._M_elems[3] = 0;
          local_d8.val.m_backend.data._M_elems[4] = 0;
          local_d8.val.m_backend.data._M_elems[5] = 0;
          local_d8.val.m_backend.data._M_elems._24_5_ = 0;
          local_d8.val.m_backend.data._M_elems[7]._1_3_ = 0;
          local_d8.val.m_backend.data._M_elems._32_5_ = 0;
          local_d8.val.m_backend.data._M_elems[9]._1_3_ = 0;
          local_d8.val.m_backend.exp = 0;
          local_d8.val.m_backend.neg = false;
          v = pNVar8;
          if ((&local_d8 != pNVar6) && (v = pNVar6, pNVar8 != &local_d8)) {
            uVar4 = *(undefined8 *)((pNVar8->val).m_backend.data._M_elems + 8);
            local_d8.val.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_d8.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_d8.val.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(pNVar8->val).m_backend.data._M_elems;
            local_d8.val.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((pNVar8->val).m_backend.data._M_elems + 2);
            local_d8.val.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((pNVar8->val).m_backend.data._M_elems + 4);
            uVar4 = *(undefined8 *)((pNVar8->val).m_backend.data._M_elems + 6);
            local_d8.val.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_d8.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_d8.val.m_backend.exp = (pNVar8->val).m_backend.exp;
            local_d8.val.m_backend.neg = (pNVar8->val).m_backend.neg;
            local_d8.val.m_backend.fpclass = (pNVar8->val).m_backend.fpclass;
            local_d8.val.m_backend.prec_elem = (pNVar8->val).m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)&local_d8,(cpp_dec_float<50U,_int,_void> *)v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_98,(cpp_dec_float<50U,_int,_void> *)&local_d8);
          pNVar8 = pNVar8 + 1;
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
        fVar10 = local_98.fpclass;
        iVar11 = local_98.prec_elem;
      }
      local_38 = CONCAT35(local_98.data._M_elems[9]._1_3_,local_98.data._M_elems._32_5_);
      local_58[0] = local_98.data._M_elems[0];
      local_58[1] = local_98.data._M_elems[1];
      auStack_50[0] = local_98.data._M_elems[2];
      auStack_50[1] = local_98.data._M_elems[3];
      local_48[0] = local_98.data._M_elems[4];
      local_48[1] = local_98.data._M_elems[5];
      uStack_40 = CONCAT35(local_98.data._M_elems[7]._1_3_,local_98.data._M_elems._24_5_);
      iVar2 = (result->super_IdxSet).num;
      (result->super_IdxSet).num = iVar2 + 1;
      (result->super_IdxSet).idx[iVar2] = (int)lVar9;
      pnVar5 = (result->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar5[lVar9].m_backend.data._M_elems + 8) = local_38;
      puVar1 = pnVar5[lVar9].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_98.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = uStack_40;
      *(undefined8 *)&pnVar5[lVar9].m_backend.data = local_98.data._M_elems._0_8_;
      *(undefined8 *)(pnVar5[lVar9].m_backend.data._M_elems + 2) = local_98.data._M_elems._8_8_;
      pnVar5[lVar9].m_backend.exp = local_98.exp;
      pnVar5[lVar9].m_backend.neg = local_98.neg;
      pnVar5[lVar9].m_backend.fpclass = fVar10;
      pnVar5[lVar9].m_backend.prec_elem = iVar11;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)((ulong)((long)(x->
                                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(x->
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x49249249);
  }
  return;
}

Assistant:

void SPxBasisBase<R>::multWithBase(SSVectorBase<R>& x, SSVectorBase<R>& result) const
{
   assert(status() > SINGULAR);
   assert(theLP->dim() == x.dim());
   assert(x.dim() == result.dim());

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   result.clear();

   assert(matrixIsSetup);

   for(int i = 0; i < x.dim(); ++i)
      result.add(i, (*matrix[i]) * x);

   return;
}